

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object3D.h
# Opt level: O1

void __thiscall Plane::Plane(Plane *this,Vector3f *normal,float d,Material *m)

{
  (this->super_Object3D).type._M_dataplus._M_p = (pointer)&(this->super_Object3D).type.field_2;
  (this->super_Object3D).type._M_string_length = 0;
  (this->super_Object3D).type.field_2._M_local_buf[0] = '\0';
  (this->super_Object3D).material = m;
  (this->super_Object3D)._vptr_Object3D = (_func_int **)&PTR__Object3D_0013fa50;
  Vector3f::Vector3f(&this->_normal,normal);
  this->_d = d;
  return;
}

Assistant:

Plane(const Vector3f &normal,
          float d,
          Material *m) :
            Object3D(m),
            _normal(normal),
            _d(d) {
    }